

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall wallet::WalletBatch::ReadPool(WalletBatch *this,int64_t nPool,CKeyPool *keypool)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> this_00;
  bool bVar2;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->m_batch)._M_t.
       super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
       _M_t.
       super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
       super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
  paVar1 = &local_58.first.field_2;
  local_58.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,DBKeys::POOL_abi_cxx11_,DAT_006c4250 + DBKeys::POOL_abi_cxx11_);
  local_58.second = nPool;
  bVar2 = DatabaseBatch::Read<std::pair<std::__cxx11::string,long>,wallet::CKeyPool>
                    (this_00._M_head_impl,&local_58,keypool);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::ReadPool(int64_t nPool, CKeyPool& keypool)
{
    return m_batch->Read(std::make_pair(DBKeys::POOL, nPool), keypool);
}